

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void codeDeferredSeek(WhereInfo *pWInfo,Index *pIdx,int iCur,int iIdxCur)

{
  ushort uVar1;
  Parse *pPVar2;
  Vdbe *p;
  Table *pTVar3;
  i16 *piVar4;
  Parse *pPVar5;
  int *zP4;
  ulong uVar6;
  
  pPVar2 = pWInfo->pParse;
  p = pPVar2->pVdbe;
  sqlite3VdbeAddOp3(p,0x86,iIdxCur,0,iCur);
  if ((pWInfo->wctrlFlags & 0x20) != 0) {
    pPVar5 = pPVar2->pToplevel;
    if (pPVar2->pToplevel == (Parse *)0x0) {
      pPVar5 = pPVar2;
    }
    if (pPVar5->writeMask == 0) {
      pTVar3 = pIdx->pTable;
      zP4 = (int *)sqlite3DbMallocZero(pPVar2->db,(long)pTVar3->nCol * 4 + 4);
      if (zP4 != (int *)0x0) {
        *zP4 = (int)pTVar3->nCol;
        uVar1 = pIdx->nColumn;
        if (1 < uVar1) {
          piVar4 = pIdx->aiColumn;
          uVar6 = 0;
          do {
            if (-1 < piVar4[uVar6]) {
              zP4[(ulong)(ushort)piVar4[uVar6] + 1] = (int)uVar6 + 1;
            }
            uVar6 = uVar6 + 1;
          } while (uVar1 - 1 != uVar6);
        }
        sqlite3VdbeChangeP4(p,-1,(char *)zP4,-0xf);
        return;
      }
    }
  }
  return;
}

Assistant:

static void codeDeferredSeek(
  WhereInfo *pWInfo,              /* Where clause context */
  Index *pIdx,                    /* Index scan is using */
  int iCur,                       /* Cursor for IPK b-tree */
  int iIdxCur                     /* Index cursor */
){
  Parse *pParse = pWInfo->pParse; /* Parse context */
  Vdbe *v = pParse->pVdbe;        /* Vdbe to generate code within */

  assert( iIdxCur>0 );
  assert( pIdx->aiColumn[pIdx->nColumn-1]==-1 );
  
  sqlite3VdbeAddOp3(v, OP_DeferredSeek, iIdxCur, 0, iCur);
  if( (pWInfo->wctrlFlags & WHERE_OR_SUBCLAUSE)
   && DbMaskAllZero(sqlite3ParseToplevel(pParse)->writeMask)
  ){
    int i;
    Table *pTab = pIdx->pTable;
    int *ai = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*(pTab->nCol+1));
    if( ai ){
      ai[0] = pTab->nCol;
      for(i=0; i<pIdx->nColumn-1; i++){
        assert( pIdx->aiColumn[i]<pTab->nCol );
        if( pIdx->aiColumn[i]>=0 ) ai[pIdx->aiColumn[i]+1] = i+1;
      }
      sqlite3VdbeChangeP4(v, -1, (char*)ai, P4_INTARRAY);
    }
  }
}